

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

void BasePort::AddHardwareVersion(unsigned_long hver)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long in_RDI;
  ulong uVar3;
  unsigned_long local_8;
  
  if (in_RDI == 0) {
    return;
  }
  if ((long)SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    uVar2 = (long)SupportedHardware.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)SupportedHardware.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (*SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_start == in_RDI) {
      return;
    }
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (uVar2 + (uVar2 == 0) == uVar3) break;
      uVar1 = uVar3 + 1;
    } while (SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar3] != in_RDI);
    if (uVar3 < uVar2) {
      return;
    }
  }
  if (SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&SupportedHardware,
               (iterator)
               SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_finish = in_RDI;
    SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         SupportedHardware.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

void BasePort::AddHardwareVersion(unsigned long hver)
{
    // Add if non-zero and not already on list
    if (hver && !HardwareVersionValid(hver))
        SupportedHardware.push_back(hver);
}